

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkAddBuffsInt(Abc_Ntk_t *pNtkInit,int fReverse,int nImprove,int fVerbose)

{
  Abc_Obj_t *pFanin;
  uint nLevelMax;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long *plVar4;
  Abc_Obj_t *pFaninNew;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint local_60;
  uint local_5c;
  
  pNtk = Abc_NtkDup(pNtkInit);
  nLevelMax = Abc_NtkLevel(pNtk);
  for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar11);
    *(uint *)&pAVar2->field_0x14 =
         *(uint *)&pAVar2->field_0x14 & 0xfff | nLevelMax * 0x1000 + 0x1000;
  }
  pVVar3 = Abc_NtkDfs(pNtk,1);
  if (fReverse == 0) {
    iVar11 = 0;
    if (nImprove < 1) {
      nImprove = 0;
    }
    do {
      if (iVar11 == nImprove) break;
      iVar13 = pVVar3->nSize;
      local_5c = 0;
      local_60 = 0;
LAB_006c31fc:
      if (0 < iVar13) {
        iVar13 = iVar13 + -1;
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,iVar13);
        uVar5 = *(uint *)&pAVar2->field_0x14;
        uVar7 = uVar5 >> 0xc;
        if (nLevelMax < uVar7) {
          __assert_fail("pObj->Level <= (unsigned)nLevelMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0x969,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
        }
        uVar10 = (pAVar2->vFanouts).nSize;
        uVar6 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar6 = 0;
        }
        uVar9 = 0;
        while (uVar6 != uVar9) {
          uVar10 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[uVar9]] +
                            0x14) >> 0xc;
          if (uVar10 <= uVar7) {
            __assert_fail("pFanin->Level > pObj->Level",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0x96c,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
          uVar9 = uVar9 + 1;
          if (uVar10 == uVar7 + 1) goto LAB_006c31fc;
        }
        uVar7 = (pAVar2->vFanins).nSize;
        uVar6 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar6 = 0;
        }
        iVar12 = 1;
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          uVar7 = Abc_NtkAddBuffsEval2
                            (pAVar2,(Abc_Obj_t *)
                                    pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[uVar9]]);
          iVar12 = iVar12 - (uVar7 ^ 1);
        }
        if (-1 < iVar12) {
          *(uint *)&pAVar2->field_0x14 = uVar5 + 0x1000;
          local_5c = local_5c + 1;
          local_60 = local_60 + iVar12;
        }
        goto LAB_006c31fc;
      }
      if (fVerbose != 0) {
        printf("Shifted %5d nodes up with total gain %5d.\n",(ulong)local_5c,(ulong)local_60);
      }
      iVar11 = iVar11 + 1;
    } while (local_5c != 0);
  }
  else {
    if (0x3ffff < (int)nLevelMax) {
      __assert_fail("nLevelMax < (1<<18)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0x934,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
    }
    iVar11 = pVVar3->nSize;
    while (0 < iVar11) {
      iVar11 = iVar11 + -1;
      plVar4 = (long *)Vec_PtrEntry(pVVar3,iVar11);
      uVar5 = *(uint *)((long)plVar4 + 0x14) & 0xfff | 0x40000000;
      *(uint *)((long)plVar4 + 0x14) = uVar5;
      for (lVar8 = 0; lVar8 < *(int *)((long)plVar4 + 0x2c); lVar8 = lVar8 + 1) {
        uVar10 = (*(uint *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                     (long)*(int *)(plVar4[6] + lVar8 * 4) * 8) + 0x14) >> 0xc) - 1;
        uVar7 = uVar5 >> 0xc;
        if ((int)uVar10 < (int)(uVar5 >> 0xc)) {
          uVar7 = uVar10;
        }
        uVar5 = uVar5 & 0xfff | uVar7 << 0xc;
        *(uint *)((long)plVar4 + 0x14) = uVar5;
      }
      if (uVar5 < 0x1000) {
        __assert_fail("pObj->Level > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0x93a,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
      }
    }
    for (iVar11 = 0; iVar11 < pNtk->vCis->nSize; iVar11 = iVar11 + 1) {
      pAVar2 = Abc_NtkCi(pNtk,iVar11);
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff;
    }
    iVar11 = 0;
    if (nImprove < 1) {
      nImprove = 0;
    }
    do {
      if (iVar11 == nImprove) break;
      local_5c = 0;
      local_60 = 0;
      for (iVar13 = 0; iVar13 < pVVar3->nSize; iVar13 = iVar13 + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pVVar3,iVar13);
        uVar5 = *(uint *)&pAVar2->field_0x14;
        if (uVar5 < 0x1000) {
          __assert_fail("pObj->Level > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0x946,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
        }
        uVar7 = (pAVar2->vFanins).nSize;
        if ((int)uVar7 < 1) {
          uVar7 = 0;
        }
        uVar6 = 0;
        while (uVar7 != uVar6) {
          uVar10 = *(uint *)((long)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[uVar6]] +
                            0x14) >> 0xc;
          if (uVar5 >> 0xc <= uVar10) {
            __assert_fail("pFanin->Level < pObj->Level",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0x949,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
          uVar6 = uVar6 + 1;
          if (uVar10 + 1 == uVar5 >> 0xc) goto LAB_006c3188;
        }
        iVar12 = -1;
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          iVar1 = Abc_NtkAddBuffsEval(pAVar2,(Abc_Obj_t *)
                                             pAVar2->pNtk->vObjs->pArray
                                             [(pAVar2->vFanins).pArray[uVar6]]);
          iVar12 = iVar12 + iVar1;
        }
        if (-1 < iVar12) {
          *(uint *)&pAVar2->field_0x14 = uVar5 - 0x1000;
          local_5c = local_5c + 1;
          local_60 = local_60 + iVar12;
        }
LAB_006c3188:
      }
      if (fVerbose != 0) {
        printf("Shifted %5d nodes down with total gain %5d.\n",(ulong)local_5c,(ulong)local_60);
      }
      iVar11 = iVar11 + 1;
    } while (local_5c != 0);
  }
  Vec_PtrFree(pVVar3);
  pVVar3 = Vec_PtrStart(pNtk->vObjs->nSize * (nLevelMax + 1));
  for (iVar11 = 0; iVar11 < pNtk->vObjs->nSize; iVar11 = iVar11 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar11);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      if (iVar11 == pVVar3->nSize / (int)(nLevelMax + 1)) break;
      uVar5 = *(uint *)&pAVar2->field_0x14 & 0xf;
      if ((uVar5 < 8) && ((0x98U >> uVar5 & 1) != 0)) {
        for (lVar8 = 0; lVar8 < (pAVar2->vFanins).nSize; lVar8 = lVar8 + 1) {
          pFanin = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar8]];
          uVar7 = *(uint *)&pAVar2->field_0x14 >> 0xc;
          uVar5 = *(uint *)&pFanin->field_0x14 >> 0xc;
          if (uVar7 <= uVar5) {
            __assert_fail("Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0x98b,"Abc_Ntk_t *Abc_NtkAddBuffsInt(Abc_Ntk_t *, int, int, int)");
          }
          uVar7 = uVar7 - 1;
          if (uVar7 != uVar5) {
            pFaninNew = Abc_NtkAddBuffsOne(pVVar3,pFanin,uVar7,nLevelMax);
            Abc_ObjPatchFanin(pAVar2,pFanin,pFaninNew);
          }
        }
      }
    }
  }
  Vec_PtrFree(pVVar3);
  for (iVar11 = 0; iVar11 < pNtk->vCos->nSize; iVar11 = iVar11 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar11);
    *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff;
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkAddBuffsInt( Abc_Ntk_t * pNtkInit, int fReverse, int nImprove, int fVerbose )
{
    Vec_Ptr_t * vBuffs;
    Abc_Ntk_t * pNtk = Abc_NtkDup( pNtkInit );
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    int i, k, Iter, nLevelMax = Abc_NtkLevel( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = nLevelMax + 1;
    if ( fReverse )
    {
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        assert( nLevelMax < (1<<18) );
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObj->Level = (1<<18);
            Abc_ObjForEachFanout( pObj, pFanin, k )
                pObj->Level = Abc_MinInt( pFanin->Level - 1, pObj->Level );
            assert( pObj->Level > 0 );
        }
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->Level = 0;

        // move the nodes down one step at a time
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = -1;
                assert( pObj->Level > 0 );
                Abc_ObjForEachFanin( pObj, pFanin, k )
                {
                    assert( pFanin->Level < pObj->Level );
                    if ( pFanin->Level + 1 == pObj->Level )
                        break;
                }
                if ( k < Abc_ObjFaninNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain += Abc_NtkAddBuffsEval( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level--;
                    Counter++;
                    TotalGain += CountGain;
                }
            }
            if ( fVerbose )
                printf( "Shifted %5d nodes down with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    else
    {
        // move the nodes up one step at a time
        Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 1 );
        for ( Iter = 0; Iter < nImprove; Iter++ )
        {
            int Counter = 0, TotalGain = 0;
            Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pObj, i )
            {
                int CountGain = 1;
                assert( pObj->Level <= (unsigned)nLevelMax );
                Abc_ObjForEachFanout( pObj, pFanin, k )
                {
                    assert( pFanin->Level > pObj->Level );
                    if ( pFanin->Level == pObj->Level + 1 )
                        break;
                }
                if ( k < Abc_ObjFanoutNum(pObj) ) // cannot move
                    continue;
                Abc_ObjForEachFanin( pObj, pFanin, k )
                    CountGain -= !Abc_NtkAddBuffsEval2( pObj, pFanin );
                if ( CountGain >= 0 ) // can move
                {
                    pObj->Level++;
                    Counter++;
                    TotalGain += CountGain;
                }
            } 
            if ( fVerbose )
                printf( "Shifted %5d nodes up with total gain %5d.\n", Counter, TotalGain );
            if ( Counter == 0 )
                break;
        }
        Vec_PtrFree( vNodes );
    }
    vBuffs = Vec_PtrStart( Abc_NtkObjNumMax(pNtk) * (nLevelMax + 1) );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( i == Vec_PtrSize(vBuffs) / (nLevelMax + 1) )
            break;
        if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsCo(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( Abc_ObjLevel(pObj) - 1 >= Abc_ObjLevel(pFanin) );
            if ( Abc_ObjLevel(pObj) - 1 == Abc_ObjLevel(pFanin) )
                continue;
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Abc_ObjLevel(pObj) - 1, nLevelMax );
            Abc_ObjPatchFanin( pObj, pFanin, pBuffer );
        }
    }
    Vec_PtrFree( vBuffs );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->Level = 0;
    return pNtk;
}